

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O0

bool __thiscall bloaty::dwarf::AddressRanges::NextRange(AddressRanges *this)

{
  uint64_t uVar1;
  const_pointer pvVar2;
  CompilationUnitSizes *in_RDI;
  char *start;
  string_view *in_stack_ffffffffffffffc8;
  const_pointer __str;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  const_pointer local_18;
  bool local_1;
  
  local_1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 10));
  if (!local_1) {
    local_18 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 10));
    uVar1 = CompilationUnitSizes::ReadAddress(in_RDI,in_stack_ffffffffffffffc8);
    *(uint64_t *)(in_RDI + 0x14) = uVar1;
    uVar1 = CompilationUnitSizes::ReadAddress(in_RDI,in_stack_ffffffffffffffc8);
    *(uint64_t *)(in_RDI + 0x16) = uVar1;
    __str = local_18;
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 10));
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,__str,(long)pvVar2 - (long)local_18);
    *(size_t *)(in_RDI + 2) = local_28._M_len;
    *(char **)(in_RDI + 4) = local_28._M_str;
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool AddressRanges::NextRange() {
  if (unit_remaining_.empty()) {
    return false;
  }

  const char* start = unit_remaining_.data();
  address_ = sizes_.ReadAddress(&unit_remaining_);
  length_ = sizes_.ReadAddress(&unit_remaining_);
  data_ = string_view(start, unit_remaining_.data() - start);
  return true;
}